

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> * __thiscall
kj::_::PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::
await_resume(Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>
             *__return_storage_ptr__,
            PromiseAwaiter<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>
            *this)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  undefined2 uVar6;
  int iVar7;
  undefined4 uVar8;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>_2
  *paVar9;
  void *unaff_retaddr;
  
  PromiseAwaiterBase::awaitResumeImpl
            (&this->super_PromiseAwaiterBase,&(this->result).super_ExceptionOrValue,unaff_retaddr);
  paVar9 = (anon_union_64_1_a8c68091_for_NullableValue<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>_2
            *)0x0;
  if ((this->result).value.ptr.isSet != false) {
    paVar9 = &(this->result).value.ptr.field_1;
  }
  pSVar1 = (paVar9->value).super_Reader._reader.segment;
  pCVar2 = (paVar9->value).super_Reader._reader.capTable;
  pvVar3 = (paVar9->value).super_Reader._reader.data;
  pWVar4 = (paVar9->value).super_Reader._reader.pointers;
  SVar5 = (((Reader *)paVar9)->_reader).pointerCount;
  uVar6 = *(undefined2 *)&(((Reader *)paVar9)->_reader).field_0x26;
  iVar7 = (((Reader *)paVar9)->_reader).nestingLimit;
  uVar8 = *(undefined4 *)&(((Reader *)paVar9)->_reader).field_0x2c;
  (__return_storage_ptr__->super_Reader)._reader.dataSize = (((Reader *)paVar9)->_reader).dataSize;
  (__return_storage_ptr__->super_Reader)._reader.pointerCount = SVar5;
  *(undefined2 *)&(__return_storage_ptr__->super_Reader)._reader.field_0x26 = uVar6;
  (__return_storage_ptr__->super_Reader)._reader.nestingLimit = iVar7;
  *(undefined4 *)&(__return_storage_ptr__->super_Reader)._reader.field_0x2c = uVar8;
  (__return_storage_ptr__->super_Reader)._reader.data = pvVar3;
  (__return_storage_ptr__->super_Reader)._reader.pointers = pWVar4;
  (__return_storage_ptr__->super_Reader)._reader.segment = pSVar1;
  (__return_storage_ptr__->super_Reader)._reader.capTable = pCVar2;
  (__return_storage_ptr__->hook).disposer = (paVar9->value).hook.disposer;
  (__return_storage_ptr__->hook).ptr = (paVar9->value).hook.ptr;
  (paVar9->value).hook.ptr = (ResponseHook *)0x0;
  return __return_storage_ptr__;
}

Assistant:

KJ_NOINLINE T await_resume() {
    // This is marked noinline in order to ensure __builtin_return_address() is accurate for stack
    // trace purposes. In my experimentation, this method was not inlined anyway even in opt
    // builds, but I want to make sure it doesn't suddenly start being inlined later causing stack
    // traces to break. (I also tried always-inline, but this did not appear to cause the compiler
    // to inline the method -- perhaps a limitation of coroutines?)
#if __GNUC__
    awaitResumeImpl(result, __builtin_return_address(0));
#elif _MSC_VER
    awaitResumeImpl(result, _ReturnAddress());
#else
    #error "please implement for your compiler"
#endif
    auto value = kj::_::readMaybe(result.value);
    KJ_IASSERT(value != nullptr, "Neither exception nor value present.");
    return T(kj::mv(*value));
  }